

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::BasicResourceUniform::Run(BasicResourceUniform *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLint GVar2;
  int *piVar3;
  bool *compile_error;
  long lVar4;
  int data;
  string local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,
             "\nlayout(local_size_x = 1) in;\nbuffer Result {\n  int g_result;\n};\nuniform float g_0;\nuniform vec2 g_1;\nuniform vec3 g_2;\nuniform vec4 g_3;\nuniform mat2 g_4;\nuniform mat2x3 g_5;\nuniform mat2x4 g_6;\nuniform mat3x2 g_7;\nuniform mat3 g_8;\nuniform mat3x4 g_9;\nuniform mat4x2 g_10;\nuniform mat4x3 g_11;\nuniform mat4 g_12;\nuniform int g_13;\nuniform ivec2 g_14;\nuniform ivec3 g_15;\nuniform ivec4 g_16;\nuniform uint g_17;\nuniform uvec2 g_18;\nuniform uvec3 g_19;\nuniform uvec4 g_20;\n\nvoid main() {\n  g_result = 1;\n\n  if (g_0 != 1.0) g_result = 0;\n  if (g_1 != vec2(2.0, 3.0)) g_result = 0;\n  if (g_2 != vec3(4.0, 5.0, 6.0)) g_result = 0;\n  if (g_3 != vec4(7.0, 8.0, 9.0, 10.0)) g_result = 0;\n\n  if (g_4 != mat2(11.0, 12.0, 13.0, 14.0)) g_result = 0;\n  if (g_5 != mat2x3(15.0, 16.0, 17.0, 18.0, 19.0, 20.0)) g_result = 0;\n  if (g_6 != mat2x4(21.0, 22.0, 23.0, 24.0, 25.0, 26.0, 27.0, 28.0)) g_result = 0;\n\n  if (g_7 != mat3x2(29.0, 30.0, 31.0, 32.0, 33.0, 34.0)) g_result = 0;\n  if (g_8 != mat3(35.0, 36.0, 37.0, 38.0, 39.0, 40.0, 41.0, 42.0, 43.0)) g_result = 0;\n  if (g_9 != mat3x4(44.0, 45.0, 46.0, 47.0, 48.0, 49.0, 50.0, 51.0, 52.0, 53.0, 54.0, 55.0)) g_result = 0;\n\n  if (g_10 != mat4x2(56.0, 57.0, 58.0, 59.0, 60.0, 61.0, 62.0, 63.0)) g_result = 0;\n  if (g_11 != mat4x3(63.0, 64.0, 65.0, 66.0, 67.0, 68.0, 69.0, 70.0, 71.0, 27.0, 73, 74.0)) g_result = 0;\n  if (g_12 != mat4(75.0, 76.0, 77.0, 78.0, 79.0, 80.0, 81.0, 82.0, 83.0, 84.0, 85.0, 86.0, 87.0, 88.0, 89.0, 90.0)) g_result = 0;\n\n  if (g_13 != 91) g_result = 0;\n  if (g_14 != ivec2(92, 93)) g_result = 0;\n  if (g_15 != ivec3(94, 95, 96)) g_result = 0;\n  if (g_16 != ivec4(97, 98, 99, 100)) g_result = 0;\n\n  if (g_17 != 101u) g_result = 0;\n  if (g_18 != uvec2(102u, 103u)) g_result = 0;\n  if (g_19 != uvec3(104u, 105u, 106u)) g_result = 0;\n  if (g_20 != uvec4(107u, 108u, 109u, 110u)) g_result = 0;\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_68);
  this->m_program = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar4 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_storage_buffer);
    local_68._M_dataplus._M_p._0_4_ = 0x7b;
    lVar4 = 0;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,&local_68,0x88e4);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_0");
    glu::CallLogWrapper::glUniform1f(this_00,GVar2,1.0);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_1");
    glu::CallLogWrapper::glUniform2f(this_00,GVar2,2.0,3.0);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_2");
    glu::CallLogWrapper::glUniform3f(this_00,GVar2,4.0,5.0,6.0);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_3");
    glu::CallLogWrapper::glUniform4f(this_00,GVar2,7.0,8.0,9.0,10.0);
    local_68._M_dataplus._M_p = (pointer)0x4140000041300000;
    local_68._M_string_length = 0x4160000041500000;
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_4");
    glu::CallLogWrapper::glUniformMatrix2fv(this_00,GVar2,1,'\0',(GLfloat *)&local_68);
    local_68._M_dataplus._M_p = (pointer)0x4180000041700000;
    local_68._M_string_length = 0x4190000041880000;
    local_68.field_2._M_allocated_capacity = 0x41a0000041980000;
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_5");
    glu::CallLogWrapper::glUniformMatrix2x3fv(this_00,GVar2,1,'\0',(GLfloat *)&local_68);
    local_68.field_2._M_allocated_capacity = 0x41d0000041c80000;
    local_68.field_2._8_8_ = 0x41e0000041d80000;
    local_68._M_dataplus._M_p = (pointer)0x41b0000041a80000;
    local_68._M_string_length = 0x41c0000041b80000;
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_6");
    glu::CallLogWrapper::glUniformMatrix2x4fv(this_00,GVar2,1,'\0',(GLfloat *)&local_68);
    local_68._M_dataplus._M_p = (pointer)0x41f0000041e80000;
    local_68._M_string_length = 0x4200000041f80000;
    local_68.field_2._M_allocated_capacity = 0x4208000042040000;
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_7");
    glu::CallLogWrapper::glUniformMatrix3x2fv(this_00,GVar2,1,'\0',(GLfloat *)&local_68);
    local_68.field_2._M_allocated_capacity = 0x42200000421c0000;
    local_68.field_2._8_8_ = 0x4228000042240000;
    local_68._M_dataplus._M_p = (pointer)0x42100000420c0000;
    local_68._M_string_length = 0x4218000042140000;
    local_48 = CONCAT44(local_48._4_4_,0x422c0000);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_8");
    glu::CallLogWrapper::glUniformMatrix3fv(this_00,GVar2,1,'\0',(GLfloat *)&local_68);
    local_48 = 0x4254000042500000;
    uStack_40 = 0x425c000042580000;
    local_68.field_2._M_allocated_capacity = 0x4244000042400000;
    local_68.field_2._8_8_ = 0x424c000042480000;
    local_68._M_dataplus._M_p = (pointer)0x4234000042300000;
    local_68._M_string_length = 0x423c000042380000;
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_9");
    glu::CallLogWrapper::glUniformMatrix3x4fv(this_00,GVar2,1,'\0',(GLfloat *)&local_68);
    local_68.field_2._M_allocated_capacity = 0x4274000042700000;
    local_68.field_2._8_8_ = 0x427c000042780000;
    local_68._M_dataplus._M_p = (pointer)0x4264000042600000;
    local_68._M_string_length = 0x426c000042680000;
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_10");
    glu::CallLogWrapper::glUniformMatrix4x2fv(this_00,GVar2,1,'\0',(GLfloat *)&local_68);
    local_48 = 0x41d80000428e0000;
    uStack_40 = 0x4294000042920000;
    local_68.field_2._M_allocated_capacity = 0x4288000042860000;
    local_68.field_2._8_8_ = 0x428c0000428a0000;
    local_68._M_dataplus._M_p = (pointer)0x42800000427c0000;
    local_68._M_string_length = 0x4284000042820000;
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_11");
    glu::CallLogWrapper::glUniformMatrix4x3fv(this_00,GVar2,1,'\0',(GLfloat *)&local_68);
    local_38 = 0x42b0000042ae0000;
    uStack_30 = 0x42b4000042b20000;
    local_48 = 0x42a8000042a60000;
    uStack_40 = 0x42ac000042aa0000;
    local_68.field_2._M_allocated_capacity = 0x42a00000429e0000;
    local_68.field_2._8_8_ = 0x42a4000042a20000;
    local_68._M_dataplus._M_p = (pointer)0x4298000042960000;
    local_68._M_string_length = 0x429c0000429a0000;
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_12");
    glu::CallLogWrapper::glUniformMatrix4fv(this_00,GVar2,1,'\0',(GLfloat *)&local_68);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_13");
    glu::CallLogWrapper::glUniform1i(this_00,GVar2,0x5b);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_14");
    glu::CallLogWrapper::glUniform2i(this_00,GVar2,0x5c,0x5d);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_15");
    glu::CallLogWrapper::glUniform3i(this_00,GVar2,0x5e,0x5f,0x60);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_16");
    glu::CallLogWrapper::glUniform4i(this_00,GVar2,0x61,0x62,99,100);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_17");
    glu::CallLogWrapper::glUniform1ui(this_00,GVar2,0x65);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_18");
    glu::CallLogWrapper::glUniform2ui(this_00,GVar2,0x66,0x67);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_19");
    glu::CallLogWrapper::glUniform3ui(this_00,GVar2,0x68,0x69,0x6a);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_20");
    glu::CallLogWrapper::glUniform4ui(this_00,GVar2,0x6b,0x6c,0x6d,0x6e);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    piVar3 = (int *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,4,1);
    if (*piVar3 != 1) {
      anon_unknown_0::Output("Data is %d should be 1.\n");
      lVar4 = -1;
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs = NL
			"layout(local_size_x = 1) in;" NL "buffer Result {" NL "  int g_result;" NL "};" NL "uniform float g_0;" NL
			"uniform vec2 g_1;" NL "uniform vec3 g_2;" NL "uniform vec4 g_3;" NL "uniform mat2 g_4;" NL
			"uniform mat2x3 g_5;" NL "uniform mat2x4 g_6;" NL "uniform mat3x2 g_7;" NL "uniform mat3 g_8;" NL
			"uniform mat3x4 g_9;" NL "uniform mat4x2 g_10;" NL "uniform mat4x3 g_11;" NL "uniform mat4 g_12;" NL
			"uniform int g_13;" NL "uniform ivec2 g_14;" NL "uniform ivec3 g_15;" NL "uniform ivec4 g_16;" NL
			"uniform uint g_17;" NL "uniform uvec2 g_18;" NL "uniform uvec3 g_19;" NL "uniform uvec4 g_20;" NL NL
			"void main() {" NL "  g_result = 1;" NL NL "  if (g_0 != 1.0) g_result = 0;" NL
			"  if (g_1 != vec2(2.0, 3.0)) g_result = 0;" NL "  if (g_2 != vec3(4.0, 5.0, 6.0)) g_result = 0;" NL
			"  if (g_3 != vec4(7.0, 8.0, 9.0, 10.0)) g_result = 0;" NL NL
			"  if (g_4 != mat2(11.0, 12.0, 13.0, 14.0)) g_result = 0;" NL
			"  if (g_5 != mat2x3(15.0, 16.0, 17.0, 18.0, 19.0, 20.0)) g_result = 0;" NL
			"  if (g_6 != mat2x4(21.0, 22.0, 23.0, 24.0, 25.0, 26.0, 27.0, 28.0)) g_result = 0;" NL NL
			"  if (g_7 != mat3x2(29.0, 30.0, 31.0, 32.0, 33.0, 34.0)) g_result = 0;" NL
			"  if (g_8 != mat3(35.0, 36.0, 37.0, 38.0, 39.0, 40.0, 41.0, 42.0, 43.0)) g_result = 0;" NL
			"  if (g_9 != mat3x4(44.0, 45.0, 46.0, 47.0, 48.0, 49.0, 50.0, 51.0, 52.0, 53.0, 54.0, 55.0)) g_result = "
			"0;" NL NL "  if (g_10 != mat4x2(56.0, 57.0, 58.0, 59.0, 60.0, 61.0, 62.0, 63.0)) g_result = 0;" NL
			"  if (g_11 != mat4x3(63.0, 64.0, 65.0, 66.0, 67.0, 68.0, 69.0, 70.0, 71.0, 27.0, 73, 74.0)) g_result = "
			"0;" NL "  if (g_12 != mat4(75.0, 76.0, 77.0, 78.0, 79.0, 80.0, 81.0, 82.0, 83.0, 84.0, 85.0, 86.0, 87.0, "
			"88.0, 89.0, 90.0)) g_result = 0;" NL NL "  if (g_13 != 91) g_result = 0;" NL
			"  if (g_14 != ivec2(92, 93)) g_result = 0;" NL "  if (g_15 != ivec3(94, 95, 96)) g_result = 0;" NL
			"  if (g_16 != ivec4(97, 98, 99, 100)) g_result = 0;" NL NL "  if (g_17 != 101u) g_result = 0;" NL
			"  if (g_18 != uvec2(102u, 103u)) g_result = 0;" NL
			"  if (g_19 != uvec3(104u, 105u, 106u)) g_result = 0;" NL
			"  if (g_20 != uvec4(107u, 108u, 109u, 110u)) g_result = 0;" NL "}";

		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		glUseProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		/* create buffer */
		{
			const int data = 123;
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), &data, GL_STATIC_DRAW);
		}

		glUniform1f(glGetUniformLocation(m_program, "g_0"), 1.0f);
		glUniform2f(glGetUniformLocation(m_program, "g_1"), 2.0f, 3.0f);
		glUniform3f(glGetUniformLocation(m_program, "g_2"), 4.0f, 5.0f, 6.0f);
		glUniform4f(glGetUniformLocation(m_program, "g_3"), 7.0f, 8.0f, 9.0f, 10.0f);

		/* mat2 */
		{
			const GLfloat value[4] = { 11.0f, 12.0f, 13.0f, 14.0f };
			glUniformMatrix2fv(glGetUniformLocation(m_program, "g_4"), 1, GL_FALSE, value);
		}
		/* mat2x3 */
		{
			const GLfloat value[6] = { 15.0f, 16.0f, 17.0f, 18.0f, 19.0f, 20.0f };
			glUniformMatrix2x3fv(glGetUniformLocation(m_program, "g_5"), 1, GL_FALSE, value);
		}
		/* mat2x4 */
		{
			const GLfloat value[8] = { 21.0f, 22.0f, 23.0f, 24.0f, 25.0f, 26.0f, 27.0f, 28.0f };
			glUniformMatrix2x4fv(glGetUniformLocation(m_program, "g_6"), 1, GL_FALSE, value);
		}

		/* mat3x2 */
		{
			const GLfloat value[6] = { 29.0f, 30.0f, 31.0f, 32.0f, 33.0f, 34.0f };
			glUniformMatrix3x2fv(glGetUniformLocation(m_program, "g_7"), 1, GL_FALSE, value);
		}
		/* mat3 */
		{
			const GLfloat value[9] = { 35.0f, 36.0f, 37.0f, 38.0f, 39.0f, 40.0f, 41.0f, 42.0f, 43.0f };
			glUniformMatrix3fv(glGetUniformLocation(m_program, "g_8"), 1, GL_FALSE, value);
		}
		/* mat3x4 */
		{
			const GLfloat value[12] = { 44.0f, 45.0f, 46.0f, 47.0f, 48.0f, 49.0f,
										50.0f, 51.0f, 52.0f, 53.0f, 54.0f, 55.0f };
			glUniformMatrix3x4fv(glGetUniformLocation(m_program, "g_9"), 1, GL_FALSE, value);
		}

		/* mat4x2 */
		{
			const GLfloat value[8] = { 56.0f, 57.0f, 58.0f, 59.0f, 60.0f, 61.0f, 62.0f, 63.0f };
			glUniformMatrix4x2fv(glGetUniformLocation(m_program, "g_10"), 1, GL_FALSE, value);
		}
		/* mat4x3 */
		{
			const GLfloat value[12] = {
				63.0f, 64.0f, 65.0f, 66.0f, 67.0f, 68.0f, 69.0f, 70.0f, 71.0f, 27.0f, 73, 74.0f
			};
			glUniformMatrix4x3fv(glGetUniformLocation(m_program, "g_11"), 1, GL_FALSE, value);
		}
		/* mat4 */
		{
			const GLfloat value[16] = { 75.0f, 76.0f, 77.0f, 78.0f, 79.0f, 80.0f, 81.0f, 82.0f,
										83.0f, 84.0f, 85.0f, 86.0f, 87.0f, 88.0f, 89.0f, 90.0f };
			glUniformMatrix4fv(glGetUniformLocation(m_program, "g_12"), 1, GL_FALSE, value);
		}

		glUniform1i(glGetUniformLocation(m_program, "g_13"), 91);
		glUniform2i(glGetUniformLocation(m_program, "g_14"), 92, 93);
		glUniform3i(glGetUniformLocation(m_program, "g_15"), 94, 95, 96);
		glUniform4i(glGetUniformLocation(m_program, "g_16"), 97, 98, 99, 100);

		glUniform1ui(glGetUniformLocation(m_program, "g_17"), 101);
		glUniform2ui(glGetUniformLocation(m_program, "g_18"), 102, 103);
		glUniform3ui(glGetUniformLocation(m_program, "g_19"), 104, 105, 106);
		glUniform4ui(glGetUniformLocation(m_program, "g_20"), 107, 108, 109, 110);

		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		long error = NO_ERROR;
		/* validate */
		{
			int* data;
			data = static_cast<int*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(int), GL_MAP_READ_BIT));
			if (data[0] != 1)
			{
				Output("Data is %d should be 1.\n", data[0]);
				error = ERROR;
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		}

		return error;
	}